

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

bool __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::set(option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,string *value)

{
  undefined8 in_RSI;
  long *in_RDI;
  exception *e;
  string local_38 [56];
  
  (**(code **)(*in_RDI + 0x60))(local_38,in_RDI,in_RSI);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xf),local_38);
  std::__cxx11::string::~string(local_38);
  *(undefined1 *)(in_RDI + 10) = 1;
  return true;
}

Assistant:

bool set(const std::string& value) {
            try {
                actual = read(value);
                has = true;
            } catch (const std::exception& e) {
                return false;
            }
            return true;
        }